

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

TEdge * ClipperLib::FindNextLocMin(TEdge *E)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  
  do {
    for (; ((pTVar2 = E->Prev, (E->Bot).X != (pTVar2->Bot).X || ((E->Bot).Y != (pTVar2->Bot).Y)) ||
           (((E->Curr).X == (E->Top).X && ((E->Curr).Y == (E->Top).Y)))); E = E->Next) {
    }
    if ((E->Dx != -1e+40) || (pTVar1 = E, NAN(E->Dx))) {
      if (pTVar2->Dx != -1e+40) {
        return E;
      }
      pTVar1 = E;
      if (NAN(pTVar2->Dx)) {
        return E;
      }
    }
    do {
      pTVar2 = pTVar1;
      pTVar1 = pTVar2->Prev;
      E = pTVar2;
    } while (pTVar1->Dx == -1e+40);
    for (; (E->Dx == -1e+40 && (!NAN(E->Dx))); E = E->Next) {
    }
    if ((E->Top).Y != (E->Prev->Bot).Y) {
      if ((pTVar1->Bot).X < (E->Bot).X) {
        E = pTVar2;
      }
      return E;
    }
  } while( true );
}

Assistant:

TEdge* FindNextLocMin(TEdge* E)
{
  for (;;)
  {
    while (E->Bot != E->Prev->Bot || E->Curr == E->Top) E = E->Next;
    if (!IsHorizontal(*E) && !IsHorizontal(*E->Prev)) break;
    while (IsHorizontal(*E->Prev)) E = E->Prev;
    TEdge* E2 = E;
    while (IsHorizontal(*E)) E = E->Next;
    if (E->Top.Y == E->Prev->Bot.Y) continue; //ie just an intermediate horz.
    if (E2->Prev->Bot.X < E->Bot.X) E = E2;
    break;
  }
  return E;
}